

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MeshPointOrigin::MeshPointOrigin
          (MeshPointOrigin *this,string *name,int priority,string *description)

{
  string *in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RCX);
  *(undefined4 *)(in_RDI + 0x40) = in_EDX;
  return;
}

Assistant:

MeshPointOrigin(const std::string& name, int priority, const std::string& description) : m_name(name), m_description(description), m_priority(priority){}